

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_tostring(lua_State *L)

{
  TValue *pTVar1;
  cTValue *pcVar2;
  GCstr *pGVar3;
  cTValue *mo;
  TValue *o;
  lua_State *L_local;
  
  pTVar1 = lj_lib_checkany(L,1);
  L->top = pTVar1 + 1;
  pcVar2 = lj_meta_lookup(L,pTVar1,MM_tostring);
  if (pcVar2->u64 == 0xffffffffffffffff) {
    if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
      lj_gc_step(L);
    }
    pTVar1 = L->base;
    pGVar3 = lj_strfmt_obj(L,L->base);
    pTVar1[-2].u64 = (ulong)pGVar3 | 0xfffd800000000000;
    L_local._4_4_ = 2;
  }
  else {
    L->base[-2] = *pcVar2;
    L_local._4_4_ = -1;
  }
  return L_local._4_4_;
}

Assistant:

LJLIB_ASM(tostring)		LJLIB_REC(.)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo;
  L->top = o+1;  /* Only keep one argument. */
  if (!tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  }
  lj_gc_check(L);
  setstrV(L, L->base-1-LJ_FR2, lj_strfmt_obj(L, L->base));
  return FFH_RES(1);
}